

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_function_global.h
# Opt level: O3

vector<Eigen::Array<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Array<double,_1,_2,_1,_1,_2>_>_> *
__thiscall
lf::mesh::utils::
MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_unary_tests.cc:73:5)>
::operator()(vector<Eigen::Array<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Array<double,_1,_2,_1,_1,_2>_>_>
             *__return_storage_ptr__,
            MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_unary_tests_cc:73:5)>
            *this,Entity *e,MatrixXd *local)

{
  pointer *ppAVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  double dVar4;
  iterator __position;
  int iVar5;
  dim_t dVar6;
  undefined4 extraout_var;
  Scalar *pSVar7;
  Scalar *pSVar8;
  vector<Eigen::Array<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Array<double,_1,_2,_1,_1,_2>_>_>
  *extraout_RAX;
  long i;
  MatrixXd global_points;
  stringstream ss;
  string local_258;
  string local_238;
  string local_210;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> local_1f0;
  PointerType local_1b8;
  long lStack_1b0;
  ostream local_1a8 [8];
  XprTypeNested pMStack_1a0;
  long local_198;
  long lStack_190;
  Index local_188;
  
  iVar5 = (*this->_vptr_MeshFunctionGlobal[4])(this);
  dVar6 = base::internal::DimensionImpl((RefElType)iVar5);
  if (e[1]._vptr_Entity == (_func_int **)(ulong)dVar6) {
    (__return_storage_ptr__->
    super__Vector_base<Eigen::Array<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Array<double,_1,_2,_1,_1,_2>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<Eigen::Array<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Array<double,_1,_2,_1,_1,_2>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<Eigen::Array<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Array<double,_1,_2,_1,_1,_2>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<Eigen::Array<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Array<double,_1,_2,_1,_1,_2>_>_>
    ::reserve(__return_storage_ptr__,(size_type)e[2]._vptr_Entity);
    iVar5 = (*this->_vptr_MeshFunctionGlobal[3])(this);
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar5) + 0x18))
              (&local_258,(long *)CONCAT44(extraout_var,iVar5),e);
    if (0 < (long)e[2]._vptr_Entity) {
      i = 0;
      do {
        Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                  (&local_1f0,(Matrix<double,__1,__1,_0,__1,__1> *)&local_258,i);
        local_188 = local_1f0.
                    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                    .m_outerStride;
        local_198 = local_1f0.
                    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                    .m_startRow.m_value;
        lStack_190 = local_1f0.
                     super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                     .m_startCol.m_value;
        local_1a8[0] = (ostream)local_1f0.
                                super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                                .
                                super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                                ._16_1_;
        local_1a8[1] = (ostream)local_1f0.
                                super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                                .
                                super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                                ._17_1_;
        local_1a8[2] = (ostream)local_1f0.
                                super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                                .
                                super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                                ._18_1_;
        local_1a8[3] = (ostream)local_1f0.
                                super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                                .
                                super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                                ._19_1_;
        local_1a8[4] = (ostream)local_1f0.
                                super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                                .
                                super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                                ._20_1_;
        local_1a8[5] = (ostream)local_1f0.
                                super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                                .
                                super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                                ._21_1_;
        local_1a8[6] = (ostream)local_1f0.
                                super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                                .
                                super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                                ._22_1_;
        local_1a8[7] = (ostream)local_1f0.
                                super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                                .
                                super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                                ._23_1_;
        pMStack_1a0 = local_1f0.
                      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                      .m_xpr;
        local_1b8 = local_1f0.
                    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                    .m_data;
        lStack_1b0 = local_1f0.
                     super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                     .
                     super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                     .
                     super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                     .m_rows.m_value;
        pSVar7 = Eigen::
                 DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>
                 ::operator[]((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                               *)&local_1b8,1);
        pSVar8 = Eigen::
                 DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>
                 ::operator[]((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                               *)&local_1b8,0);
        dVar4 = *pSVar8;
        local_238._M_string_length._0_4_ = SUB84(dVar4,0);
        local_238._M_string_length._4_4_ = (uint)((ulong)dVar4 >> 0x20) ^ 0x80000000;
        local_238._M_dataplus._M_p = (pointer)*pSVar7;
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<Eigen::Array<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Array<double,_1,_2,_1,_1,_2>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<Eigen::Array<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Array<double,_1,_2,_1,_1,_2>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Eigen::Array<double,1,2,1,1,2>,std::allocator<Eigen::Array<double,1,2,1,1,2>>>
          ::_M_realloc_insert<Eigen::Array<double,1,2,1,1,2>>
                    ((vector<Eigen::Array<double,1,2,1,1,2>,std::allocator<Eigen::Array<double,1,2,1,1,2>>>
                      *)__return_storage_ptr__,__position,(Array<double,_1,_2,_1,_1,_2> *)&local_238
                    );
        }
        else {
          ((__position._M_current)->super_PlainObjectBase<Eigen::Array<double,_1,_2,_1,_1,_2>_>).
          m_storage.m_data.array[0] = (double)local_238._M_dataplus._M_p;
          ((__position._M_current)->super_PlainObjectBase<Eigen::Array<double,_1,_2,_1,_1,_2>_>).
          m_storage.m_data.array[1] = -dVar4;
          ppAVar1 = &(__return_storage_ptr__->
                     super__Vector_base<Eigen::Array<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Array<double,_1,_2,_1,_1,_2>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppAVar1 = *ppAVar1 + 1;
        }
        i = i + 1;
      } while (i < (long)e[2]._vptr_Entity);
    }
    free(local_258._M_dataplus._M_p);
    return extraout_RAX;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,"mismatch between entity dimension and local.rows()",0x32);
  paVar2 = &local_258.field_2;
  local_258._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_258,"e.RefEl().Dimension() == local.rows()","");
  paVar3 = &local_238.field_2;
  local_238._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_238,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/mesh_function_global.h"
             ,"");
  std::__cxx11::stringbuf::str();
  base::AssertionFailed(&local_258,&local_238,0x50,&local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar3) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  local_258._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"false","");
  local_238._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_238,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/mesh_function_global.h"
             ,"");
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"");
  base::AssertionFailed(&local_258,&local_238,0x50,&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_258);
  abort();
}

Assistant:

std::vector<F_return_type> operator()(const mesh::Entity& e,
                                        const Eigen::MatrixXd& local) const {
    LF_ASSERT_MSG(e.RefEl().Dimension() == local.rows(),
                  "mismatch between entity dimension and local.rows()");
    std::vector<F_return_type> result;
    result.reserve(local.cols());
    auto global_points = e.Geometry()->Global(local);
    for (long i = 0; i < local.cols(); ++i) {
      result.push_back(f_(global_points.col(i)));
    }
    return result;
  }